

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int v2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  LogMessage local_140;
  CheckOpString local_e0;
  LogMessage local_d8;
  string *local_78;
  _Check_string *_result;
  string local_68 [8];
  string prefix_attacher_data;
  string local_38 [8];
  string early_stderr;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  fLB::FLAGS_colorlogtostderr = 0;
  fLB::FLAGS_timestamp_in_logfile_name = 1;
  early_stderr.field_2._8_8_ = argv;
  argv_local._0_4_ = argc;
  setbuf(_stderr,(char *)0x0);
  google::CaptureTestStderr();
  LogWithLevels(fLI::FLAGS_v,fLI::FLAGS_stderrthreshold,(bool)(fLB::FLAGS_logtostderr & 1),
                (bool)(fLB::FLAGS_alsologtostderr & 1));
  LogWithLevels(0,0,false,false);
  google::GetCapturedTestStderr_abi_cxx11_();
  bVar1 = google::IsGoogleLoggingInitialized();
  if (bVar1) {
    fprintf(_stderr,"Check failed: %s\n","!(IsGoogleLoggingInitialized())");
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,"good data",(allocator<char> *)((long)&_result + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&_result + 7));
  google::InitGoogleLogging(*(char **)early_stderr.field_2._8_8_,PrefixAttacher,local_68);
  bVar1 = google::IsGoogleLoggingInitialized();
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s\n","IsGoogleLoggingInitialized()");
    exit(1);
  }
  google::RunSpecifiedBenchmarks();
  fLB::FLAGS_logtostderr = 1;
  google::InitGoogleTest((int *)&argv_local,(char **)early_stderr.field_2._8_8_);
  iVar2 = google::RUN_ALL_TESTS();
  iVar2 = google::GetReferenceableValue(iVar2);
  v2 = google::GetReferenceableValue(0);
  local_78 = google::Check_EQImpl_abi_cxx11_(iVar2,v2,"RUN_ALL_TESTS() == 0");
  if (local_78 != (string *)0x0) {
    google::CheckOpString::CheckOpString(&local_e0,local_78);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
               ,0xf3,&local_e0);
    google::LogMessage::stream(&local_d8);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_d8);
  }
  google::CaptureTestStderr();
  google::LogMessage::LogMessage(&local_140,"dummy",-1,GLOG_INFO);
  poVar3 = google::LogMessage::stream(&local_140);
  std::operator<<(poVar3,local_38);
  google::LogMessage::~LogMessage(&local_140);
  TestLogging(true);
  TestRawLogging();
  TestLoggingLevels();
  TestVLogModule();
  TestLogString();
  TestLogSink();
  TestLogToString();
  TestLogSinkWaitTillSent();
  TestCHECK();
  TestDCHECK();
  TestSTREQ();
  std::operator+(&local_160,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 fLS::FLAGS_test_srcdir_buf_abi_cxx11_,"/src/logging_unittest.err");
  bVar1 = google::MungeAndDiffTestStderr(&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    fLB::FLAGS_logtostderr = 0;
    fLB::FLAGS_logtostdout = 1;
    fLI::FLAGS_stderrthreshold = 4;
    google::CaptureTestStdout();
    TestRawLogging();
    TestLoggingLevels();
    TestLogString();
    TestLogSink();
    TestLogToString();
    TestLogSinkWaitTillSent();
    TestCHECK();
    TestDCHECK();
    TestSTREQ();
    std::operator+(&local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   fLS::FLAGS_test_srcdir_buf_abi_cxx11_,"/src/logging_unittest.out");
    bVar1 = google::MungeAndDiffTestStdout(&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      fLB::FLAGS_logtostdout = 0;
      TestBasename();
      TestBasenameAppendWhenNoTimestamp();
      TestTwoProcessesWrite();
      TestSymlink();
      TestExtension();
      TestWrapper();
      TestErrno();
      TestTruncate();
      TestCustomLoggerDeletionOnShutdown();
      TestLogPeriodically();
      fprintf(_stdout,"PASS\n");
      argv_local._4_4_ = 0;
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_38);
      return argv_local._4_4_;
    }
    fprintf(_stderr,"Check failed: %s\n",
            "MungeAndDiffTestStdout(FLAGS_test_srcdir + \"/src/logging_unittest.out\")");
    exit(1);
  }
  fprintf(_stderr,"Check failed: %s\n",
          "MungeAndDiffTestStderr(FLAGS_test_srcdir + \"/src/logging_unittest.err\")");
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
  FLAGS_colorlogtostderr = false;
  FLAGS_timestamp_in_logfile_name = true;

  // Make sure stderr is not buffered as stderr seems to be buffered
  // on recent windows.
  setbuf(stderr, nullptr);

  // Test some basics before InitGoogleLogging:
  CaptureTestStderr();
  LogWithLevels(FLAGS_v, FLAGS_stderrthreshold, FLAGS_logtostderr,
                FLAGS_alsologtostderr);
  LogWithLevels(0, 0, false, false);  // simulate "before global c-tors"
  const string early_stderr = GetCapturedTestStderr();

  EXPECT_FALSE(IsGoogleLoggingInitialized());

  // Setting a custom prefix generator (it will use the default format so that
  // the golden outputs can be reused):
  string prefix_attacher_data = "good data";
  InitGoogleLogging(argv[0], &PrefixAttacher,
                    static_cast<void*>(&prefix_attacher_data));

  EXPECT_TRUE(IsGoogleLoggingInitialized());

  RunSpecifiedBenchmarks();

  FLAGS_logtostderr = true;

  InitGoogleTest(&argc, argv);
#ifdef HAVE_LIB_GMOCK
  InitGoogleMock(&argc, argv);
#endif

#ifdef GLOG_USE_GFLAGS
  ParseCommandLineFlags(&argc, &argv, true);
#endif

  // so that death tests run before we use threads
  CHECK_EQ(RUN_ALL_TESTS(), 0);

  CaptureTestStderr();

  // re-emit early_stderr
  LogMessage("dummy", LogMessage::kNoLogPrefix, GLOG_INFO).stream()
      << early_stderr;

  TestLogging(true);
  TestRawLogging();
  TestLoggingLevels();
  TestVLogModule();
  TestLogString();
  TestLogSink();
  TestLogToString();
  TestLogSinkWaitTillSent();
  TestCHECK();
  TestDCHECK();
  TestSTREQ();

  // TODO: The golden test portion of this test is very flakey.
  EXPECT_TRUE(
      MungeAndDiffTestStderr(FLAGS_test_srcdir + "/src/logging_unittest.err"));

  FLAGS_logtostderr = false;

  FLAGS_logtostdout = true;
  FLAGS_stderrthreshold = NUM_SEVERITIES;
  CaptureTestStdout();
  TestRawLogging();
  TestLoggingLevels();
  TestLogString();
  TestLogSink();
  TestLogToString();
  TestLogSinkWaitTillSent();
  TestCHECK();
  TestDCHECK();
  TestSTREQ();
  EXPECT_TRUE(
      MungeAndDiffTestStdout(FLAGS_test_srcdir + "/src/logging_unittest.out"));
  FLAGS_logtostdout = false;

  TestBasename();
  TestBasenameAppendWhenNoTimestamp();
  TestTwoProcessesWrite();
  TestSymlink();
  TestExtension();
  TestWrapper();
  TestErrno();
  TestTruncate();
  TestCustomLoggerDeletionOnShutdown();
  TestLogPeriodically();

  fprintf(stdout, "PASS\n");
  return 0;
}